

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestCases.cpp
# Opt level: O2

void Test27(void)

{
  CMReturn In;
  allocator<char> local_20fa;
  allocator<char> local_20f9;
  undefined1 local_20f8;
  undefined7 uStack_20f7;
  undefined1 uStack_20f0;
  undefined7 uStack_20ef;
  undefined1 uStack_20e8;
  undefined7 uStack_20e7;
  undefined8 uStack_20e0;
  undefined8 local_20d8;
  undefined8 uStack_20d0;
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_20c8;
  string local_20b0;
  string local_2090;
  CMReturn res;
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  map;
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  local_2040;
  ConfusableMatcher matcher;
  
  GetDefaultMap_abi_cxx11_();
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::vector(&local_20c8,&map);
  local_2040._M_buckets = &local_2040._M_single_bucket;
  local_2040._M_bucket_count = 1;
  local_2040._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_2040._M_element_count = 0;
  local_2040._M_rehash_policy._M_max_load_factor = 1.0;
  local_2040._M_rehash_policy._4_4_ = 0;
  local_2040._M_rehash_policy._M_next_resize = 0;
  local_2040._M_single_bucket = (__node_base_ptr)0x0;
  ConfusableMatcher::ConfusableMatcher
            (&matcher,&local_20c8,
             (unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&local_2040,true);
  std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  ::~_Hashtable(&local_2040);
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~vector(&local_20c8);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_2090,"BB AAA",&local_20f9);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_20b0,"A",&local_20fa);
  local_20f8 = 1;
  uStack_20f7 = 0;
  uStack_20f0 = 0;
  uStack_20ef = 0;
  uStack_20e8 = 0;
  uStack_20e7 = 0;
  uStack_20e0 = 1000000;
  local_20d8 = 0;
  uStack_20d0 = 0;
  ConfusableMatcher::IndexOf
            (&res,&matcher,&local_2090,&local_20b0,
             (CMOptions)ZEXT3248(CONCAT824(1000000,CONCAT816(0,ZEXT816(1)))));
  std::__cxx11::string::~string((string *)&local_20b0);
  std::__cxx11::string::~string((string *)&local_2090);
  In.Size = res.Size;
  In.Start = res.Start;
  In.Status = res.Status;
  In._20_4_ = res._20_4_;
  AssertMatch(In,3,3);
  ConfusableMatcher::~ConfusableMatcher(&matcher);
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~vector(&map);
  return;
}

Assistant:

void Test27()
{
	auto map = GetDefaultMap();

	CMOptions opts = { };
	opts.TimeoutNs = 1000000;
	opts.MatchRepeating = true;
	auto matcher = ConfusableMatcher(map, {});
	auto res = matcher.IndexOf("BB AAA", "A", opts);
	AssertMatch(res, 3, 3);
}